

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O0

void __thiscall ThreadPool::RunInThread(ThreadPool *this)

{
  bool bVar1;
  undefined1 local_30 [8];
  CallFunc task;
  ThreadPool *this_local;
  
  task._M_invoker = (_Invoker_type)this;
  while ((this->m_bRunning & 1U) != 0) {
    Take((CallFunc *)local_30,this);
    bVar1 = std::function::operator_cast_to_bool((function *)local_30);
    if (bVar1) {
      std::function<void_()>::operator()((function<void_()> *)local_30);
    }
    std::function<void_()>::~function((function<void_()> *)local_30);
  }
  return;
}

Assistant:

void ThreadPool::RunInThread()
{
	while(m_bRunning)
	{
		CallFunc task = Take();
		if (task)
		{
			task();
		}
	}
}